

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O3

BuildValue * __thiscall
llbuild::buildsystem::ExternalCommand::computeCommandResult
          (BuildValue *__return_storage_ptr__,ExternalCommand *this,BuildSystem *system,
          TaskInterface ti)

{
  pointer ppBVar1;
  BuildNode *this_00;
  FileSystem *fileSystem;
  pointer ppBVar2;
  ArrayRef<llbuild::basic::FileInfo> outputInfos_00;
  SmallVector<llbuild::basic::FileInfo,_8U> outputInfos;
  TaskInterface local_328;
  FileInfo local_318;
  SmallVectorTemplateBase<llbuild::basic::FileInfo,_true> local_2c0;
  undefined1 local_2b0 [640];
  
  local_328.ctx = ti.ctx;
  local_328.impl = ti.impl;
  local_2c0.super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>.super_SmallVectorBase.
  BeginX = local_2b0;
  local_2c0.super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>.super_SmallVectorBase.
  Size = 0;
  local_2c0.super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>.super_SmallVectorBase.
  Capacity = 8;
  ppBVar2 = (this->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar2 != ppBVar1) {
    do {
      this_00 = *ppBVar2;
      if (this_00->commandTimestamp == true) {
        local_318.checksum.bytes[0x10] = '\0';
        local_318.checksum.bytes[0x11] = '\0';
        local_318.checksum.bytes[0x12] = '\0';
        local_318.checksum.bytes[0x13] = '\0';
        local_318.checksum.bytes[0x14] = '\0';
        local_318.checksum.bytes[0x15] = '\0';
        local_318.checksum.bytes[0x16] = '\0';
        local_318.checksum.bytes[0x17] = '\0';
        local_318.checksum.bytes[0x18] = '\0';
        local_318.checksum.bytes[0x19] = '\0';
        local_318.checksum.bytes[0x1a] = '\0';
        local_318.checksum.bytes[0x1b] = '\0';
        local_318.checksum.bytes[0x1c] = '\0';
        local_318.checksum.bytes[0x1d] = '\0';
        local_318.checksum.bytes[0x1e] = '\0';
        local_318.checksum.bytes[0x1f] = '\0';
        local_318.checksum.bytes[0] = '\0';
        local_318.checksum.bytes[1] = '\0';
        local_318.checksum.bytes[2] = '\0';
        local_318.checksum.bytes[3] = '\0';
        local_318.checksum.bytes[4] = '\0';
        local_318.checksum.bytes[5] = '\0';
        local_318.checksum.bytes[6] = '\0';
        local_318.checksum.bytes[7] = '\0';
        local_318.checksum.bytes[8] = '\0';
        local_318.checksum.bytes[9] = '\0';
        local_318.checksum.bytes[10] = '\0';
        local_318.checksum.bytes[0xb] = '\0';
        local_318.checksum.bytes[0xc] = '\0';
        local_318.checksum.bytes[0xd] = '\0';
        local_318.checksum.bytes[0xe] = '\0';
        local_318.checksum.bytes[0xf] = '\0';
        local_318.modTime.seconds = 0;
        local_318.modTime.nanoseconds = 0;
        local_318.mode = 0;
        local_318.size = 0;
        local_318.device = 0;
        local_318.inode = 0;
        local_318.size = core::TaskInterface::currentEpoch(&local_328);
      }
      else if (this_00->type == Virtual) {
        local_318.checksum.bytes[0x10] = '\0';
        local_318.checksum.bytes[0x11] = '\0';
        local_318.checksum.bytes[0x12] = '\0';
        local_318.checksum.bytes[0x13] = '\0';
        local_318.checksum.bytes[0x14] = '\0';
        local_318.checksum.bytes[0x15] = '\0';
        local_318.checksum.bytes[0x16] = '\0';
        local_318.checksum.bytes[0x17] = '\0';
        local_318.checksum.bytes[0x18] = '\0';
        local_318.checksum.bytes[0x19] = '\0';
        local_318.checksum.bytes[0x1a] = '\0';
        local_318.checksum.bytes[0x1b] = '\0';
        local_318.checksum.bytes[0x1c] = '\0';
        local_318.checksum.bytes[0x1d] = '\0';
        local_318.checksum.bytes[0x1e] = '\0';
        local_318.checksum.bytes[0x1f] = '\0';
        local_318.checksum.bytes[0] = '\0';
        local_318.checksum.bytes[1] = '\0';
        local_318.checksum.bytes[2] = '\0';
        local_318.checksum.bytes[3] = '\0';
        local_318.checksum.bytes[4] = '\0';
        local_318.checksum.bytes[5] = '\0';
        local_318.checksum.bytes[6] = '\0';
        local_318.checksum.bytes[7] = '\0';
        local_318.checksum.bytes[8] = '\0';
        local_318.checksum.bytes[9] = '\0';
        local_318.checksum.bytes[10] = '\0';
        local_318.checksum.bytes[0xb] = '\0';
        local_318.checksum.bytes[0xc] = '\0';
        local_318.checksum.bytes[0xd] = '\0';
        local_318.checksum.bytes[0xe] = '\0';
        local_318.checksum.bytes[0xf] = '\0';
        local_318.modTime.seconds = 0;
        local_318.modTime.nanoseconds = 0;
        local_318.mode = 0;
        local_318.size = 0;
        local_318.device = 0;
        local_318.inode = 0;
      }
      else {
        fileSystem = BuildSystem::getFileSystem(system);
        BuildNode::getFileInfo(&local_318,this_00,fileSystem);
      }
      llvm::SmallVectorTemplateBase<llbuild::basic::FileInfo,_true>::push_back
                (&local_2c0,&local_318);
      ppBVar2 = ppBVar2 + 1;
    } while (ppBVar2 != ppBVar1);
    if ((this->super_Command).outputs.
        super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->super_Command).outputs.
        super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_00176ddf;
  }
  local_318.checksum.bytes[0x10] = '\0';
  local_318.checksum.bytes[0x11] = '\0';
  local_318.checksum.bytes[0x12] = '\0';
  local_318.checksum.bytes[0x13] = '\0';
  local_318.checksum.bytes[0x14] = '\0';
  local_318.checksum.bytes[0x15] = '\0';
  local_318.checksum.bytes[0x16] = '\0';
  local_318.checksum.bytes[0x17] = '\0';
  local_318.checksum.bytes[0x18] = '\0';
  local_318.checksum.bytes[0x19] = '\0';
  local_318.checksum.bytes[0x1a] = '\0';
  local_318.checksum.bytes[0x1b] = '\0';
  local_318.checksum.bytes[0x1c] = '\0';
  local_318.checksum.bytes[0x1d] = '\0';
  local_318.checksum.bytes[0x1e] = '\0';
  local_318.checksum.bytes[0x1f] = '\0';
  local_318.checksum.bytes[0] = '\0';
  local_318.checksum.bytes[1] = '\0';
  local_318.checksum.bytes[2] = '\0';
  local_318.checksum.bytes[3] = '\0';
  local_318.checksum.bytes[4] = '\0';
  local_318.checksum.bytes[5] = '\0';
  local_318.checksum.bytes[6] = '\0';
  local_318.checksum.bytes[7] = '\0';
  local_318.checksum.bytes[8] = '\0';
  local_318.checksum.bytes[9] = '\0';
  local_318.checksum.bytes[10] = '\0';
  local_318.checksum.bytes[0xb] = '\0';
  local_318.checksum.bytes[0xc] = '\0';
  local_318.checksum.bytes[0xd] = '\0';
  local_318.checksum.bytes[0xe] = '\0';
  local_318.checksum.bytes[0xf] = '\0';
  local_318.modTime.seconds = 0;
  local_318.modTime.nanoseconds = 0;
  local_318.mode = 0;
  local_318.size = 0;
  local_318.device = 0;
  local_318.inode = 0;
  local_318.size = core::TaskInterface::currentEpoch(&local_328);
  llvm::SmallVectorTemplateBase<llbuild::basic::FileInfo,_true>::push_back(&local_2c0,&local_318);
LAB_00176ddf:
  outputInfos_00.Length._0_4_ =
       local_2c0.super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>.
       super_SmallVectorBase.Size;
  outputInfos_00.Data =
       (FileInfo *)
       local_2c0.super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>.
       super_SmallVectorBase.BeginX;
  outputInfos_00.Length._4_4_ = 0;
  BuildValue::BuildValue
            (__return_storage_ptr__,SuccessfulCommand,outputInfos_00,(CommandSignature)0x0);
  if ((undefined1 *)
      local_2c0.super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>.
      super_SmallVectorBase.BeginX != local_2b0) {
    free(local_2c0.super_SmallVectorTemplateCommon<llbuild::basic::FileInfo,_void>.
         super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

BuildValue
ExternalCommand::computeCommandResult(BuildSystem& system, core::TaskInterface ti) {
  // Capture the file information for each of the output nodes.
  //
  // FIXME: We need to delegate to the node here.
  SmallVector<FileInfo, 8> outputInfos;
  for (auto* node: outputs) {
    if (node->isCommandTimestamp()) {
      // FIXME: We currently have to shoehorn the timestamp into a fake file
      // info, but need to refactor the command result to just store the node
      // subvalues instead.
      FileInfo info{};
      info.size = ti.currentEpoch();
      outputInfos.push_back(info);
    } else if (node->isVirtual()) {
      outputInfos.push_back(FileInfo{});
    } else {
      outputInfos.push_back(node->getFileInfo(
                                system.getFileSystem()));
    }
  }

  // FIXME: If the outputs are empty, it might mean that this instance is for a custom task, which does not
  // currently have any hooks for specifying what the outputs are. It might make sense to create a new BuildValue
  // for a successful command with custom data, so that we can avoid the file system for commands that don't require
  // the filesystem. For now, hackily insert the timestamp just to differentiate between 2 build values that ran at
  // different times.
  if (outputs.size() == 0) {
    FileInfo info{};
    info.size = ti.currentEpoch();
    outputInfos.push_back(info);
  }

  return BuildValue::makeSuccessfulCommand(outputInfos);
}